

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testwinprops.cpp
# Opt level: O0

void testwin5(wins *wins_ar,int ar_len)

{
  char *local_e8;
  undefined4 local_e0;
  undefined4 local_d8;
  Am_Style *local_d0;
  undefined4 local_c8;
  undefined4 local_c0;
  undefined4 local_b8;
  undefined4 local_b0;
  undefined4 local_a8;
  undefined4 local_a0;
  undefined4 local_98;
  undefined4 local_90;
  undefined4 local_88;
  undefined8 local_80;
  Am_Style *local_70;
  Am_Drawonable *local_68;
  undefined1 *local_60;
  Am_Drawonable *local_58;
  Am_Style local_40 [16];
  Am_Drawonable *d5_array [3];
  int local_18;
  int i;
  int ar_len_local;
  wins *wins_ar_local;
  
  printf("Entering testwin5:\n");
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();
  for (local_18 = 0; local_18 < ar_len; local_18 = local_18 + 1) {
    local_68 = wins_ar[local_18].root;
    local_70 = local_40;
    Am_Style::Am_Style(local_70,(Am_Style *)&Am_No_Style);
    local_d0 = local_70;
    local_e8 = "D5 Icon";
    local_80 = 0;
    local_88 = 1;
    local_90 = 0;
    local_98 = 0;
    local_a0 = 1;
    local_a8 = 0;
    local_b0 = 0;
    local_b8 = 1;
    local_c0 = 1;
    local_c8 = 0;
    local_d8 = 0;
    local_e0 = 0;
    local_60 = (undefined1 *)&local_e8;
    local_58 = (Am_Drawonable *)(*(code *)**(undefined8 **)local_68)(local_68,10,0x28,200,200,"D5");
    d5_array[(long)local_18 + -1] = local_58;
    Am_Style::~Am_Style(local_40);
  }
  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  for (local_18 = 0; local_18 < ar_len; local_18 = local_18 + 1) {
    (**(code **)(*(long *)d5_array[(long)local_18 + -1] + 0x70))(d5_array[(long)local_18 + -1],1);
  }
  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();
  for (local_18 = 0; local_18 < ar_len; local_18 = local_18 + 1) {
    (**(code **)(*(long *)d5_array[(long)local_18 + -1] + 8))();
  }
  return;
}

Assistant:

void
testwin5(wins *wins_ar, int ar_len)
{
  printf("Entering testwin5:\n");
  printf("  Hit RETURN to create an invisible locally-scoped window:");
  getchar();

  int i;
  Am_Drawonable *d5_array[3]; // Maximum value ar_len could be
  for (i = 0; i < ar_len; i++) {
    d5_array[i] = (wins_ar[i].root)
                      ->Create(10, 40, 200, 200, "D5", "D5 Icon",
                               // visibility
                               false);
  }

  printf("  Hit RETURN to toggle visibility of locally-scoped window: ");
  getchar();
  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Set_Visible(true);
  }

  printf("  Hit RETURN to \"Destroy\" locally-scoped window:");
  getchar();

  for (i = 0; i < ar_len; i++) {
    d5_array[i]->Destroy();
  }
}